

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

string * __thiscall
util::format<char_const*,char_const(&)[29]>
          (string *__return_storage_ptr__,util *this,char *arg,char (*args) [29])

{
  char *arg_00;
  allocator<char> local_79;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_38,(char *)this,&local_79);
  std::__cxx11::string::string((string *)&local_58,local_38);
  format<char_const*>(&local_78,(util *)arg,arg_00);
  std::operator+(__return_storage_ptr__,&local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string format(T arg, Args&&... args)
{
    using namespace std; // pull in to_string for other types
    std::string s = to_string(arg) + format(std::forward<Args>(args)...);
    return s;
}